

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpMessage.cpp
# Opt level: O0

void __thiscall FIX::HttpMessage::setString(HttpMessage *this,string *string)

{
  InvalidMessage *pIVar1;
  long lVar2;
  mapped_type *this_00;
  string local_198 [8];
  string value;
  string key;
  size_type tempPos;
  size_type sepPos;
  string local_128 [8];
  string parameters;
  long local_100;
  size_type paramPos;
  undefined1 local_d2;
  allocator<char> local_d1;
  string local_d0;
  long local_b0;
  size_type httpPos;
  string local_a0;
  long local_80;
  size_type getPos;
  string line;
  allocator<char> local_41;
  string local_40;
  long local_20;
  size_type eolPos;
  string *string_local;
  HttpMessage *this_local;
  
  eolPos = (size_type)string;
  string_local = &this->m_root;
  clear(this);
  local_20 = std::__cxx11::string::find((char *)eolPos,0x2e3a75);
  if (local_20 == -1) {
    line.field_2._M_local_buf[0xb] = '\x01';
    pIVar1 = (InvalidMessage *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
    InvalidMessage::InvalidMessage(pIVar1,&local_40);
    line.field_2._M_local_buf[0xb] = '\0';
    __cxa_throw(pIVar1,&InvalidMessage::typeinfo,InvalidMessage::~InvalidMessage);
  }
  std::__cxx11::string::substr((ulong)&getPos,eolPos);
  local_80 = std::__cxx11::string::find((char *)&getPos,0x2dc475);
  if (local_80 == 0) {
    local_b0 = std::__cxx11::string::rfind((char *)&getPos,0x2dc47a);
    if (local_b0 != -1) {
      std::__cxx11::string::substr((ulong)&paramPos,(ulong)&getPos);
      std::__cxx11::string::operator=((string *)this,(string *)&paramPos);
      std::__cxx11::string::~string((string *)&paramPos);
      lVar2 = std::__cxx11::string::find_first_of((char)this,0x3f);
      if (lVar2 == -1) {
        parameters.field_2._12_4_ = 1;
      }
      else {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_128,(ulong)this);
        std::__cxx11::string::substr((ulong)&sepPos,(ulong)this);
        std::__cxx11::string::operator=((string *)this,(string *)&sepPos);
        std::__cxx11::string::~string((string *)&sepPos);
        local_100 = 0;
        while ((local_100 != -1 &&
               (lVar2 = std::__cxx11::string::find_first_of((char *)local_128,0x2dd045), lVar2 != -1
               ))) {
          local_100 = std::__cxx11::string::find_first_of((char *)local_128,0x2dc150);
          std::__cxx11::string::substr((ulong)((long)&value.field_2 + 8),(ulong)local_128);
          std::__cxx11::string::substr((ulong)local_198,(ulong)local_128);
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&this->m_parameters,(key_type *)((long)&value.field_2 + 8));
          std::__cxx11::string::operator=((string *)this_00,local_198);
          std::__cxx11::string::~string(local_198);
          std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
        }
        std::__cxx11::string::~string(local_128);
        parameters.field_2._12_4_ = 0;
      }
      std::__cxx11::string::~string((string *)&getPos);
      return;
    }
    local_d2 = 1;
    pIVar1 = (InvalidMessage *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_d1);
    InvalidMessage::InvalidMessage(pIVar1,&local_d0);
    local_d2 = 0;
    __cxa_throw(pIVar1,&InvalidMessage::typeinfo,InvalidMessage::~InvalidMessage);
  }
  httpPos._6_1_ = 1;
  pIVar1 = (InvalidMessage *)__cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"",(allocator<char> *)((long)&httpPos + 7));
  InvalidMessage::InvalidMessage(pIVar1,&local_a0);
  httpPos._6_1_ = 0;
  __cxa_throw(pIVar1,&InvalidMessage::typeinfo,InvalidMessage::~InvalidMessage);
}

Assistant:

EXCEPT(InvalidMessage) {
  clear();

  std::string::size_type eolPos = string.find("\r\n");
  if (eolPos == std::string::npos) {
    throw InvalidMessage();
  }
  std::string line = string.substr(0, eolPos);
  std::string::size_type getPos = line.find("GET ");
  if (getPos != 0) {
    throw InvalidMessage();
  }
  std::string::size_type httpPos = line.rfind("HTTP", std::string::npos);
  if (httpPos == std::string::npos) {
    throw InvalidMessage();
  }

  m_root = line.substr(getPos + 4, httpPos - 5);
  std::string::size_type paramPos = m_root.find_first_of('?');
  if (paramPos == std::string::npos) {
    return;
  }
  std::string parameters = m_root.substr(paramPos, m_root.size() - paramPos);
  m_root = m_root.substr(0, paramPos);
  paramPos = 0;

  while (paramPos != std::string::npos) {
    std::string::size_type sepPos = parameters.find_first_of("=", paramPos);
    if (sepPos == std::string::npos) {
      break;
    }
    std::string::size_type tempPos = paramPos;
    paramPos = parameters.find_first_of("&", paramPos + 1);
    std::string key = parameters.substr(tempPos + 1, sepPos - tempPos - 1);
    std::string value = parameters.substr(sepPos + 1, paramPos - sepPos - 1);
    m_parameters[key] = value;
  }
}